

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O3

void __thiscall spvtools::opt::Loop::SetMergeBlock(Loop *this,BasicBlock *merge)

{
  const_iterator cVar1;
  Instruction *pIVar2;
  key_type local_14;
  
  if (merge->function_ == (Function *)0x0) {
    __assert_fail("merge->GetParent() && \"The basic block does not belong to a function\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                  ,0x132,"void spvtools::opt::Loop::SetMergeBlock(BasicBlock *)");
  }
  pIVar2 = (merge->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar2->has_result_id_ == true) {
    Instruction::GetSingleWordOperand(pIVar2,(uint)pIVar2->has_type_id_);
  }
  cVar1 = std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&(this->loop_basic_blocks_)._M_h,&local_14);
  if (cVar1.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
    this->loop_merge_ = merge;
    pIVar2 = BasicBlock::GetLoopMergeInst(this->loop_header_);
    if (pIVar2 != (Instruction *)0x0) {
      UpdateLoopMergeInst(this);
    }
    return;
  }
  __assert_fail("!IsInsideLoop(merge) && \"The merge block is in the loop\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                ,0x134,"void spvtools::opt::Loop::SetMergeBlock(BasicBlock *)");
}

Assistant:

void Loop::SetMergeBlock(BasicBlock* merge) {
#ifndef NDEBUG
  assert(merge->GetParent() && "The basic block does not belong to a function");
#endif  // NDEBUG
  assert(!IsInsideLoop(merge) && "The merge block is in the loop");

  SetMergeBlockImpl(merge);
  if (GetHeaderBlock()->GetLoopMergeInst()) {
    UpdateLoopMergeInst();
  }
}